

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::Shaft::Decode(Shaft *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read<short>(stream,&this->m_i16CurrentRPM);
    KDataStream::Read<short>(stream,&this->m_i16OrderedRPM);
    KDataStream::Read<int>(stream,&this->m_i32RPMRateOfChange);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Shaft::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SHAFT_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_i16CurrentRPM
           >> m_i16OrderedRPM
           >> m_i32RPMRateOfChange;
}